

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QList<QNetworkCookie> * get_if<QList<QNetworkCookie>>(QVariant *v)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  QMetaType *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar2;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = true;
  if ((in_RDI != 0) && (uVar2 = true, (*(ulong *)(in_RDI + 0x18) >> 1 & 1) == 0)) {
    QVariant::Private::type((Private *)CONCAT17(1,in_stack_ffffffffffffffd0));
    QMetaType::fromType<QList<QNetworkCookie>>();
    uVar2 = operator!=((QMetaType *)CONCAT17(uVar2,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
  }
  if ((bool)uVar2 == false) {
    local_20 = (QList<QNetworkCookie> *)QVariant::data((QVariant *)0x1fad70);
  }
  else {
    local_20 = (QList<QNetworkCookie> *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

const T *get_if(const QVariant *v) noexcept
    {
        // (const) data() will not detach from is_null, return nullptr
        if (!v || v->d.is_null || v->d.type() != QMetaType::fromType<T>())
            return nullptr;
        return static_cast<const T*>(v->data());
    }